

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

void vecPrint(char *s,cupdlp_float *a,cupdlp_int n)

{
  int in_EDX;
  long in_RSI;
  undefined8 in_RDI;
  cupdlp_int i;
  int local_18;
  
  printf("%s: ",in_RDI);
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    printf("%.3f ",*(undefined8 *)(in_RSI + (long)local_18 * 8));
  }
  printf("\n");
  return;
}

Assistant:

void vecPrint(const char *s, const cupdlp_float *a, cupdlp_int n) {
  cupdlp_printf("%s: ", s);
  for (cupdlp_int i = 0; i < n; ++i) {
    cupdlp_printf("%.3f ", a[i]);
  }
  cupdlp_printf("\n");
}